

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_color_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color color,rf_color *dst,
          rf_int dst_size)

{
  long local_48;
  rf_int i;
  rf_image result;
  rf_int dst_size_local;
  rf_color *dst_local;
  int height_local;
  int width_local;
  rf_color color_local;
  
  result._16_8_ = dst_size;
  memset(&i,0,0x18);
  for (local_48 = 0; local_48 < (long)result._16_8_; local_48 = local_48 + 1) {
    dst[local_48] = color;
  }
  __return_storage_ptr__->data = dst;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
  __return_storage_ptr__->valid = true;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color_to_buffer(int width, int height, rf_color color, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    for (rf_int i = 0; i < dst_size; i++)
    {
        dst[i] = color;
    }

    return (rf_image) {
        .data   = dst,
        .width  = width,
        .height = height,
        .format = RF_UNCOMPRESSED_R8G8B8A8,
        .valid  = true,
    };
}